

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall CPU::fetch(CPU *this)

{
  oraddr_t memaddr;
  uint32_t uVar1;
  ostream *poVar2;
  
  memaddr = this->pc;
  (this->iqueue).insn_addr = memaddr;
  uVar1 = get_insn(this,memaddr);
  (this->iqueue).insn = uVar1;
  *(uint *)(putchar + *(long *)(std::cout + -0x18)) =
       *(uint *)(putchar + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int CPU::fetch()
{
	iqueue.insn_addr = pc;
	iqueue.insn = get_insn(pc);
	cout<<hex<<iqueue.insn<<endl;
	return 0;
}